

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O1

void dill_dump(dill_stream_conflict s)

{
  private_ctx pdVar1;
  jmp_table pjVar2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  char *__s;
  dill_stream_conflict pdVar8;
  uint *puVar9;
  long lVar10;
  bool bVar11;
  disassemble_info info;
  undefined1 auStack_48 [8];
  dill_stream_conflict local_40;
  uint *local_38;
  
  pdVar1 = s->p;
  puVar9 = (uint *)(pdVar1->virtual).code_base;
  local_40 = s;
  if ((puVar9 != (uint *)0x0 && (uint *)pdVar1->code_base != puVar9) &&
     (pjVar2 = (pdVar1->virtual).mach_jump, pjVar2 != (jmp_table)0x0)) {
    puVar3 = (uint *)(pdVar1->virtual).cur_ip;
    (*pjVar2->init_disassembly)(s,auStack_48);
    puts("\nDILL virtual instruction stream\n");
    uVar7 = 0;
    bVar11 = puVar9 < puVar3;
    if (bVar11) {
      printf("%p  - %x - ",puVar9,(ulong)*puVar9);
      iVar4 = (*((s->p->virtual).mach_jump)->print_insn)(s,auStack_48,puVar9);
      putchar(10);
      if (iVar4 != -1) {
        uVar7 = 1;
        do {
          puVar9 = (uint *)((long)iVar4 + (long)puVar9);
          bVar11 = puVar9 < puVar3;
          if (!bVar11) goto LAB_00108a62;
          printf("%p  - %x - ",puVar9,(ulong)*puVar9);
          iVar4 = (*((local_40->p->virtual).mach_jump)->print_insn)(local_40,auStack_48,puVar9);
          putchar(10);
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (iVar4 != -1);
      }
    }
    else {
LAB_00108a62:
      printf("\nDumped %d virtual instructions\n\n",uVar7);
    }
    if (bVar11) {
      return;
    }
  }
  pdVar8 = local_40;
  puVar9 = (uint *)local_40->p->code_base;
  if (puVar9 == (uint *)0x0) {
    puVar9 = (uint *)(local_40->p->native).code_base;
  }
  if (puVar9 == (uint *)0x0) {
    __s = "No code to dump";
  }
  else {
    iVar4 = (*local_40->j->init_disassembly)(local_40,auStack_48);
    if (iVar4 != 0) {
      if ((pdVar8->j != (pdVar8->p->virtual).mach_jump) &&
         (puVar3 = (uint *)pdVar8->p->fp, puVar3 != (uint *)0x0)) {
        puVar9 = puVar3;
      }
      uVar6 = 0;
      local_38 = puVar9;
      do {
        pdVar1 = pdVar8->p;
        if (pdVar1->cur_ip <= puVar9) {
          printf("\nDumped %d instructions\n\n",(ulong)uVar6);
          return;
        }
        if (0 < (pdVar1->branch_table).next_label) {
          lVar10 = (long)puVar9 - (long)local_38;
          uVar7 = 0;
          do {
            if (lVar10 == (pdVar1->branch_table).label_locs[uVar7]) {
              printf("L%d:\n",uVar7 & 0xffffffff);
            }
            uVar7 = uVar7 + 1;
          } while ((long)uVar7 < (long)(pdVar1->branch_table).next_label);
        }
        pdVar8 = local_40;
        if (puVar9 == (uint *)local_40->p->fp) {
          puts("Function entry point:");
        }
        printf("%p  - %x - ",puVar9,(ulong)*puVar9);
        uVar5 = (*pdVar8->j->print_insn)(pdVar8,auStack_48,puVar9);
        putchar(10);
        uVar7 = 0;
        if (0 < (int)uVar5) {
          uVar7 = (ulong)uVar5;
        }
        puVar9 = (uint *)((long)puVar9 + uVar7);
        uVar6 = uVar6 + (0 < (int)uVar5);
      } while (0 < (int)uVar5);
      return;
    }
    __s = "No native disassembler available";
  }
  puts(__s);
  return;
}

Assistant:

extern void
dill_dump(dill_stream s)
{
    struct disassemble_info info;
    void* base = s->p->code_base;
    int native_missing = 0;

    if ((base != s->p->virtual.code_base) &&
        (s->p->virtual.code_base != NULL) &&
        (s->p->virtual.mach_jump != NULL)) {
        /* Section to dump virtual code base *after* dcg completion */
        /* only do this if we're not currently in the middle of virtual
         * generation */
        void* code_limit = s->p->virtual.cur_ip;
        base = s->p->virtual.code_base;
        s->p->virtual.mach_jump->init_disassembly(s, &info);
        void* p;
        int l;
        int insn_count = 0;
        printf("\nDILL virtual instruction stream\n\n");
        for (p = base; p < code_limit;) {
            printf("%p  - %x - ", p, (unsigned)*(int*)p);
            l = s->p->virtual.mach_jump->print_insn(s, &info, (void*)p);
            printf("\n");
            if (l == -1)
                return;
            p = (char*)p + l;
            insn_count++;
        }
        printf("\nDumped %d virtual instructions\n\n", insn_count);
    }
#if defined(NO_DISASSEMBLER)
    native_missing = 1;
#endif
    base = s->p->code_base;
    if (base == NULL) {
        base = s->p->native.code_base;
    }
    if (base == NULL) {
        printf("No code to dump\n");
        return;
    }
    /* if ((s->j != s->p->virtual.mach_jump) && native_missing) { */
    /*     printf("No native disassembler available\n"); */
    /*     return; */
    /* } */
    (void)native_missing;
    if (s->j->init_disassembly(s, &info) == 0) {
        printf("No native disassembler available\n");
    } else {
        void* p;
        int l;
        int insn_count = 0;
        if ((s->j != s->p->virtual.mach_jump) && (s->p->fp != NULL))
            base = s->p->fp;
        for (p = base; (char*)p < s->p->cur_ip;) {
            int i;
            struct branch_table* t = &s->p->branch_table;
            for (i = 0; i < t->next_label; i++) {
                if (t->label_locs[i] == ((char*)p - (char*)base)) {
                    printf("L%d:\n", i);
                }
            }
            if (p == s->p->fp) {
                printf("Function entry point:\n");
            }
            printf("%p  - %x - ", p, (unsigned)*(int*)p);
            l = s->j->print_insn(s, &info, (void*)p);
            printf("\n");
            if (l <= 0)
                return;
            p = (char*)p + l;
            insn_count++;
        }
        printf("\nDumped %d instructions\n\n", insn_count);
    }
}